

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_to_wal_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  char *pcVar8;
  long extraout_RDX;
  fdb_doc *ptr_handle;
  code *__ptr;
  timeval *ptVar9;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar10;
  uint uVar11;
  uint uVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  undefined7 in_register_00000039;
  fdb_kvs_config *pfVar17;
  fdb_kvs_handle **ppfVar18;
  fdb_kvs_handle *unaff_R12;
  long lVar19;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  char cVar20;
  ulong uVar21;
  fdb_kvs_config *config;
  char *pcVar22;
  filemgr_ops *pfVar23;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s;
  fdb_doc *doc_00;
  fdb_doc *pfVar24;
  fdb_kvs_handle *doc_01;
  fdb_kvs_handle *pfVar25;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_46f0;
  fdb_kvs_handle *pfStack_46e8;
  fdb_file_handle *pfStack_46e0;
  fdb_iterator *pfStack_46d8;
  fdb_doc *pfStack_46d0;
  fdb_kvs_handle *pfStack_46c8;
  timeval tStack_46c0;
  fdb_kvs_config fStack_46b0;
  fdb_config fStack_4698;
  fdb_config *pfStack_45a0;
  fdb_kvs_handle *pfStack_4598;
  fdb_kvs_handle *pfStack_4590;
  fdb_file_handle *pfStack_4588;
  fdb_kvs_handle *pfStack_4580;
  char acStack_4577 [15];
  filemgr *pfStack_4568;
  docio_handle *pdStack_4560;
  btreeblk_handle *pbStack_4558;
  size_t sStack_4550;
  filemgr *pfStack_4548;
  docio_handle *pdStack_4540;
  btreeblk_handle *pbStack_4538;
  timeval tStack_4530;
  undefined1 auStack_4520 [76];
  uint uStack_44d4;
  char *pcStack_43e0;
  atomic<unsigned_long> aStack_43d8;
  btree *pbStack_43d0;
  fdb_kvs_handle *pfStack_43c8;
  fdb_kvs_handle *pfStack_43c0;
  code *pcStack_43b8;
  uint uStack_43a4;
  fdb_txn *pfStack_43a0;
  fdb_kvs_handle *pfStack_4398;
  fdb_iterator *pfStack_4390;
  fdb_snapshot_info_t *pfStack_4388;
  int iStack_437c;
  fdb_kvs_handle *pfStack_4378;
  fdb_kvs_handle *apfStack_4370 [3];
  uint64_t uStack_4358;
  fdb_kvs_config fStack_4350;
  char acStack_4338 [8];
  timeval tStack_4330;
  char acStack_4320 [256];
  btree bStack_4220;
  char acStack_41d0 [256];
  char acStack_40d0 [256];
  fdb_config fStack_3fd0;
  fdb_kvs_handle **ppfStack_3ed8;
  fdb_kvs_handle **ppfStack_3ed0;
  fdb_kvs_handle *pfStack_3ec8;
  fdb_kvs_handle **ppfStack_3ec0;
  fdb_kvs_handle *pfStack_3eb8;
  code *pcStack_3eb0;
  fdb_kvs_handle **ppfStack_3ea8;
  fdb_kvs_handle *pfStack_3ea0;
  fdb_kvs_handle *apfStack_3e98 [9];
  fdb_kvs_config fStack_3e50;
  timeval tStack_3e38;
  fdb_kvs_handle *apfStack_3e28 [33];
  fdb_config fStack_3d20;
  fdb_kvs_handle *apfStack_3c28 [32];
  fdb_kvs_handle *apfStack_3b28 [32];
  fdb_kvs_handle afStack_3a28 [15];
  fdb_config *pfStack_1a20;
  fdb_kvs_handle *pfStack_1a18;
  fdb_kvs_handle *pfStack_1a10;
  fdb_config *pfStack_1a08;
  fdb_kvs_handle *pfStack_1a00;
  fdb_kvs_handle *pfStack_19f8;
  fdb_kvs_handle *pfStack_19e8;
  fdb_file_handle *pfStack_19e0;
  fdb_iterator *pfStack_19d8;
  fdb_doc *pfStack_19d0;
  fdb_kvs_handle *pfStack_19c8;
  undefined1 auStack_19bf [31];
  undefined1 auStack_19a0 [72];
  fdb_config fStack_1958;
  timeval *ptStack_1860;
  fdb_kvs_handle *pfStack_1858;
  fdb_kvs_handle *pfStack_1850;
  fdb_config *pfStack_1848;
  fdb_kvs_handle *pfStack_1840;
  int iStack_182c;
  fdb_kvs_handle *pfStack_1828;
  fdb_file_handle *pfStack_1820;
  pthread_t pStack_1818;
  undefined1 auStack_180f [63];
  undefined1 auStack_17d0 [16];
  uint64_t uStack_17c0;
  fdb_config fStack_16d8;
  fdb_kvs_handle *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  filemgr_ops *pfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  fdb_kvs_handle *pfStack_15b8;
  timeval tStack_15a8;
  fdb_kvs_handle *pfStack_1598;
  fdb_kvs_handle *pfStack_1590;
  fdb_kvs_handle *pfStack_1580;
  fdb_kvs_handle *pfStack_1578;
  fdb_kvs_handle *pfStack_1570;
  fdb_file_handle *pfStack_1568;
  undefined1 auStack_155c [12];
  kvs_ops_stat *pkStack_1550;
  atomic<unsigned_long> aStack_1548;
  timeval tStack_1518;
  __atomic_base<unsigned_long> _Stack_1508;
  kvs_ops_stat *pkStack_1500;
  __atomic_base<unsigned_long> _Stack_14f8;
  fdb_kvs_info fStack_14e8;
  undefined1 uStack_1498;
  undefined1 uStack_148a;
  btree *pbStack_1480;
  code *pcStack_1460;
  uint8_t auStack_1458 [8];
  filemgr_ops *pfStack_1450;
  fdb_kvs_handle *pfStack_13c0;
  fdb_kvs_handle *pfStack_13b8;
  fdb_kvs_handle *pfStack_13b0;
  fdb_txn *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_file_handle *pfStack_1388;
  uint uStack_137c;
  fdb_kvs_handle *pfStack_1378;
  fdb_kvs_handle *pfStack_1370;
  undefined1 auStack_1368 [48];
  atomic<unsigned_long> aStack_1338;
  undefined1 auStack_1330 [32];
  fdb_kvs_info fStack_1310;
  timeval tStack_12e0;
  undefined1 auStack_12d0 [160];
  char acStack_1230 [256];
  char acStack_1130 [256];
  fdb_kvs_handle fStack_1030;
  fdb_kvs_handle *pfStack_e28;
  fdb_kvs_config *pfStack_e20;
  fdb_doc *pfStack_e18;
  code *pcStack_e10;
  undefined1 local_df8 [36];
  undefined4 local_dd4;
  fdb_kvs_handle *local_dd0;
  fdb_doc **local_dc8;
  timeval local_dc0;
  fdb_kvs_config local_db0;
  fdb_doc local_d98 [3];
  char local_c98 [256];
  char local_b98 [264];
  fdb_config local_a90;
  fdb_doc *pfStack_998;
  size_t *local_990;
  fdb_doc local_4e8 [15];
  
  pcVar8 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  pcStack_e10 = (code *)0x11a9b9;
  gettimeofday(&local_dc0,(__timezone_ptr_t)0x0);
  pcStack_e10 = (code *)0x11a9be;
  memleak_start();
  pcStack_e10 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_e10 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &local_db0;
  pcStack_e10 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  local_a90.buffercache_size = 0;
  local_a90.wal_threshold = 0x100;
  local_a90.flags = 1;
  local_a90.compaction_threshold = '\0';
  local_dd4 = (undefined4)CONCAT71(in_register_00000039,multi_kv);
  local_a90.multi_kv_instances = SUB81(pcVar8,0);
  doc_00 = (fdb_doc *)(local_df8 + 0x18);
  pcStack_e10 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&local_a90);
  ptr_handle = (fdb_doc *)local_df8;
  pcStack_e10 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)local_df8._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_e10 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_df8._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar19 = 0;
    uVar21 = 0;
    do {
      pcStack_e10 = (code *)0x11aa74;
      sprintf(local_c98,"key%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11aa8d;
      sprintf(local_b98,"meta%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11aaa3;
      sprintf((char *)local_d98,"body%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11aab6;
      sVar5 = strlen(local_c98);
      pcStack_e10 = (code *)0x11aac9;
      sVar6 = strlen(local_b98);
      pcStack_e10 = (code *)0x11aad6;
      sVar7 = strlen((char *)local_d98);
      pcStack_e10 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_998 + lVar19),local_c98,sVar5,local_b98,sVar6,
                     local_d98,sVar7);
      pcStack_e10 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,(&pfStack_998)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 300);
    pcStack_e10 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)local_df8._24_8_,'\0');
    lVar19 = 0;
    uVar21 = 0;
    do {
      local_dc8 = (fdb_doc **)((long)&pfStack_998 + lVar19);
      pcStack_e10 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_998)[uVar21]);
      pcStack_e10 = (code *)0x11ab68;
      sprintf(local_c98,"key%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11ab84;
      sprintf(local_b98,"META%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11ab9d;
      sprintf((char *)local_d98,"BODY%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11aba5;
      sVar5 = strlen(local_c98);
      pcStack_e10 = (code *)0x11abb0;
      sVar6 = strlen(local_b98);
      pcStack_e10 = (code *)0x11abbb;
      sVar7 = strlen((char *)local_d98);
      pcStack_e10 = (code *)0x11abdd;
      fdb_doc_create(local_dc8,local_c98,sVar5,local_b98,sVar6,local_d98,sVar7);
      pcStack_e10 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,(&pfStack_998)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 0x96);
    pcStack_e10 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)local_df8._24_8_,'\0');
    uVar21 = 0x96;
    doc_00 = local_4e8;
    do {
      pcStack_e10 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_00->keylen);
      pcStack_e10 = (code *)0x11ac41;
      sprintf(local_c98,"key%d",uVar21 & 0xffffffff);
      pcVar8 = local_b98;
      pcStack_e10 = (code *)0x11ac5d;
      sprintf(pcVar8,"Meta%d",uVar21 & 0xffffffff);
      ptr_handle = local_d98;
      pcStack_e10 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar21 & 0xffffffff);
      pcStack_e10 = (code *)0x11ac7e;
      unaff_R12 = (fdb_kvs_handle *)strlen(local_c98);
      pcStack_e10 = (code *)0x11ac89;
      unaff_R13 = (fdb_kvs_handle *)strlen(pcVar8);
      pcStack_e10 = (code *)0x11ac94;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_e10 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_00,local_c98,(size_t)unaff_R12,pcVar8,(size_t)unaff_R13,
                     ptr_handle,sVar5);
      pcStack_e10 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,(fdb_doc *)doc_00->keylen);
      uVar21 = uVar21 + 1;
      doc_00 = (fdb_doc *)&doc_00->metalen;
    } while (uVar21 != 300);
    pcStack_e10 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)local_df8._24_8_,'\0');
    pcStack_e10 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)local_df8,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_e10 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(local_df8 + 0x10),(void *)local_990[4],*local_990,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_e10 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_df8._0_8_,&local_dd0,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_e10 = (code *)0x11ad4c;
    fVar2 = fdb_get(local_dd0,(fdb_doc *)local_df8._16_8_);
    pfVar24 = (fdb_doc *)local_df8._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(local_df8._16_8_ + 0x40);
    config = (fdb_kvs_config *)local_990[8];
    pcStack_e10 = (code *)0x11ad78;
    iVar3 = bcmp(ptr_handle,config,*(size_t *)(local_df8._16_8_ + 0x10));
    if (iVar3 == 0) {
      if (*(uint64_t *)((long)pfVar24 + 0x28) != 0x12e) {
        pcStack_e10 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_e10 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)local_df8._16_8_);
      pcStack_e10 = (code *)0x11ada8;
      fdb_kvs_close(local_dd0);
      pcStack_e10 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)local_df8._24_8_);
      lVar19 = 0;
      do {
        pcStack_e10 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_998)[lVar19]);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 300);
      pcStack_e10 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_e10 = (code *)0x11add7;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)local_dd4 != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pcStack_e10 = (code *)0x11ae04;
      sprintf((char *)local_d98,"rollback to wal test %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_e10 = (code *)0x11ae31;
      fprintf(_stderr,pcVar8,local_d98);
      return;
    }
  }
  else {
    pcStack_e10 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_e10 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_e10 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar24 = doc_00;
    pcStack_e10 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_e10 = rollback_all_test;
  pfVar17 = config;
  rollback_to_wal_test();
  pfStack_1398 = (fdb_kvs_handle *)0x11ae87;
  fStack_1030.bub_ctx.space_used = (uint64_t)ptr_handle;
  fStack_1030.bub_ctx.handle = unaff_R12;
  pfStack_e28 = unaff_R13;
  pfStack_e20 = config;
  pfStack_e18 = pfVar24;
  pcStack_e10 = (code *)pcVar8;
  gettimeofday(&tStack_12e0,(__timezone_ptr_t)0x0);
  pfStack_1398 = (fdb_kvs_handle *)0x11ae8c;
  memleak_start();
  pfStack_1398 = (fdb_kvs_handle *)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1398 = (fdb_kvs_handle *)0x11aea8;
  fdb_get_default_config();
  pfStack_1398 = (fdb_kvs_handle *)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_1030.config.encryption_key.bytes[4] = '\0';
  fStack_1030.config.encryption_key.bytes[5] = '\0';
  fStack_1030.config.encryption_key.bytes[6] = '\0';
  fStack_1030.config.encryption_key.bytes[7] = '\0';
  fStack_1030.config.encryption_key.bytes[8] = '\0';
  fStack_1030.config.encryption_key.bytes[9] = '\0';
  fStack_1030.config.encryption_key.bytes[10] = '\0';
  fStack_1030.config.encryption_key.bytes[0xb] = '\0';
  fStack_1030.config.encryption_key.bytes[0xc] = '\0';
  fStack_1030.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1030.config.encryption_key.bytes[0xe] = '\0';
  fStack_1030.config.encryption_key.bytes[0xf] = '\0';
  fStack_1030.config.encryption_key.bytes[0x10] = '\0';
  fStack_1030.config.encryption_key.bytes[0x11] = '\0';
  fStack_1030.config.encryption_key.bytes[0x12] = '\0';
  fStack_1030.config.encryption_key.bytes[0x13] = '\0';
  fStack_1030.config._180_4_ = 1;
  fStack_1030.config.block_reusing_threshold._7_1_ = 0;
  fStack_1030.max_seqnum = 0;
  pfStack_1398 = (fdb_kvs_handle *)0x11aee8;
  fStack_1030.config.num_keeping_headers._0_1_ = (char)pfVar17;
  fdb_open(&pfStack_1388,"./mvcc_test6",(fdb_config *)&fStack_1030.config.encryption_key);
  uStack_137c = (uint)pfVar17;
  if (uStack_137c == 0) {
    pfStack_1398 = (fdb_kvs_handle *)0x11af54;
    fdb_kvs_open_default
              (pfStack_1388,(fdb_kvs_handle **)(auStack_1368 + 8),
               (fdb_kvs_config *)(auStack_1330 + 8));
    pfVar13 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)(auStack_1368 + 8);
    unaff_R12 = (fdb_kvs_handle *)(auStack_1330 + 8);
    uVar21 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11af19;
      sprintf(auStack_1330,"kv%d",uVar21 & 0xffffffff);
      pfStack_1398 = (fdb_kvs_handle *)0x11af2c;
      fdb_kvs_open(pfStack_1388,ppfVar10,auStack_1330,(fdb_kvs_config *)unaff_R12);
      uVar21 = uVar21 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar21 != 4);
    pfVar13 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar22 = (char *)0x0;
  __ptr = logCallbackFunc;
  pcVar8 = "rollback_all_test";
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11af7a;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1368 + (long)pcVar22 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar22 = (char *)((long)&((fdb_txn *)pcVar22)->handle + 1);
  } while (pfVar13 != (fdb_kvs_handle *)pcVar22);
  uVar21 = 0;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11afa9;
    sprintf(acStack_1130,"key%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11afc5;
    sprintf(acStack_1230,"meta%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11afe1;
    sprintf((char *)&fStack_1030,"body%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11aff4;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11afff;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b00a;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b02f;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar21 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar19 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b03f;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar19 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar21 * 8));
      lVar19 = lVar19 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar19);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  pfStack_1398 = (fdb_kvs_handle *)0x11b063;
  fdb_commit(pfStack_1388,'\x01');
  uVar21 = 5;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b085;
    sprintf(acStack_1130,"key%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b0a1;
    sprintf(acStack_1230,"meta%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b0bd;
    sprintf((char *)&fStack_1030,"body%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b0d0;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b0db;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b0e6;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b10b;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar21 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar19 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b11c;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar19 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar21 * 8));
      lVar19 = lVar19 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar19);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  pfStack_1398 = (fdb_kvs_handle *)0x11b13d;
  fdb_commit(pfStack_1388,'\0');
  uVar21 = 10;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b15f;
    sprintf(acStack_1130,"key%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b17b;
    sprintf(acStack_1230,"meta%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b197;
    sprintf((char *)&fStack_1030,"body%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b1aa;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b1b5;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b1c0;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b1e5;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar21 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar19 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b1f6;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar19 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar21 * 8));
      lVar19 = lVar19 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar19);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  pfStack_1398 = (fdb_kvs_handle *)0x11b21a;
  fdb_commit(pfStack_1388,'\x01');
  uVar21 = 0xf;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b23c;
    sprintf(acStack_1130,"key%d",uVar21 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b258;
    sprintf(acStack_1230,"meta%d",uVar21 & 0xffffffff);
    pfVar25 = &fStack_1030;
    pfStack_1398 = (fdb_kvs_handle *)0x11b274;
    sprintf((char *)pfVar25,"body%d",uVar21 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(auStack_12d0 + uVar21 * 8);
    pfStack_1398 = (fdb_kvs_handle *)0x11b287;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b292;
    unaff_R13 = (fdb_kvs_handle *)strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b29d;
    sVar6 = strlen((char *)pfVar25);
    pfStack_1398 = (fdb_kvs_handle *)0x11b2c2;
    fdb_doc_create((fdb_doc **)unaff_R12,acStack_1130,sVar5,acStack_1230,(size_t)unaff_R13,pfVar25,
                   sVar6);
    pcVar22 = (char *)0x0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b2d3;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + (long)pcVar22 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar22 = (char *)((long)pcVar22 + 1);
    } while (pfVar13 != (fdb_kvs_handle *)pcVar22);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  pfStack_1398 = (fdb_kvs_handle *)0x11b2f4;
  fdb_commit(pfStack_1388,'\0');
  pfStack_1398 = (fdb_kvs_handle *)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1388,(fdb_snapshot_info_t **)&pfStack_1370,(uint64_t *)&pfStack_1378);
  pcVar8 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b698;
  pcVar22 = (char *)(ulong)uStack_137c;
  cVar20 = (char)uStack_137c;
  if (cVar20 == '\0') {
    if (pfStack_1378 != (fdb_kvs_handle *)0x4) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b341;
      rollback_all_test();
    }
  }
  else if (pfStack_1378 != (fdb_kvs_handle *)0x8) {
    pfStack_1398 = (fdb_kvs_handle *)0x11b32f;
    rollback_all_test();
  }
  pfStack_1398 = (fdb_kvs_handle *)0x11b354;
  fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
  if (cVar20 == '\0') {
LAB_0011b41a:
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
    unaff_R13 = (fdb_kvs_handle *)(auStack_1368 + 8);
    if (cVar20 != '\0') {
      pcVar8 = auStack_1330;
      pcVar22 = "rollback_all_test";
      pfVar25 = (fdb_kvs_handle *)0x0;
      unaff_R12 = pfVar13;
      do {
        pfStack_1398 = (fdb_kvs_handle *)0x11b450;
        sprintf(pcVar8,"kv%d",pfVar25);
        pfStack_1398 = (fdb_kvs_handle *)0x11b465;
        fVar2 = fdb_kvs_open(pfStack_1388,(fdb_kvs_handle **)unaff_R13,pcVar8,
                             (fdb_kvs_config *)(auStack_1330 + 8));
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
        pfStack_1398 = (fdb_kvs_handle *)0x11b480;
        fVar2 = fdb_set_log_callback
                          (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                           "rollback_all_test");
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
        pfVar25 = (fdb_kvs_handle *)(ulong)((int)pfVar25 + 1);
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
        unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
      } while (unaff_R12 != (fdb_kvs_handle *)0x0);
    }
    unaff_R12 = (fdb_kvs_handle *)0x0;
    unaff_R13 = (fdb_kvs_handle *)auStack_1368;
    pcVar8 = (char *)&aStack_1338;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b4b2;
      fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                               &fStack_1310);
      __ptr = (code *)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
      if ((hbtrie *)fStack_1310.last_seqnum != (hbtrie *)0xf) {
        pfStack_1398 = (fdb_kvs_handle *)0x11b566;
        rollback_all_test();
      }
      if ((filemgr_ops *)fStack_1310.doc_count != (filemgr_ops *)0xf) {
        pfStack_1398 = (fdb_kvs_handle *)0x11b578;
        rollback_all_test();
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b4ea;
      fVar2 = fdb_get(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                      (fdb_doc *)auStack_12d0._152_8_);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
      pfStack_1398 = (fdb_kvs_handle *)0x11b512;
      fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                         *(_func_cs_off_t_int **)(auStack_12d0._0_8_ + 0x20),
                         (size_t)*(_func_int_char_ptr_int_mode_t **)auStack_12d0._0_8_,
                         (void **)unaff_R13,(size_t *)pcVar8);
      __ptr = (code *)auStack_1368._0_8_;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
      pcVar22 = *(char **)(auStack_12d0._0_8_ + 0x40);
      pfStack_1398 = (fdb_kvs_handle *)0x11b53b;
      iVar3 = bcmp(pcVar22,(void *)auStack_1368._0_8_,
                   (size_t)aStack_1338.super___atomic_base<unsigned_long>._M_i);
      if (iVar3 != 0) goto LAB_0011b67c;
      pfStack_1398 = (fdb_kvs_handle *)0x11b54b;
      free(__ptr);
      uVar12 = uStack_137c;
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
      pfVar25 = (fdb_kvs_handle *)__ptr;
    } while (pfVar13 != unaff_R12);
    pfVar25 = (fdb_kvs_handle *)0x0;
    pcVar22 = (char *)(ulong)uStack_137c;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b596;
      fVar2 = fdb_set(*(fdb_kvs_handle **)(auStack_1368 + (long)pfVar25 * 8 + 8),
                      (fdb_doc *)auStack_12d0._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
      pfVar25 = (fdb_kvs_handle *)&(pfVar25->kvs_config).field_0x1;
    } while (pfVar13 != pfVar25);
    pfStack_1398 = (fdb_kvs_handle *)0x11b5b5;
    fVar2 = fdb_commit(pfStack_1388,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
    pfStack_1398 = (fdb_kvs_handle *)0x11b5c7;
    fdb_close(pfStack_1388);
    lVar19 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b5d6;
      fdb_doc_free(*(fdb_doc **)(auStack_12d0 + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x14);
    pfStack_1398 = (fdb_kvs_handle *)0x11b5ee;
    fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1370,(uint64_t)pfStack_1378);
    pfVar25 = (fdb_kvs_handle *)0x14;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b5fb;
      fdb_shutdown();
      pfStack_1398 = (fdb_kvs_handle *)0x11b600;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)uVar12 != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b62e;
      sprintf((char *)&fStack_1030,"rollback all test %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_all_test(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b65b;
      fprintf(_stderr,pcVar8,&fStack_1030);
      return;
    }
    goto LAB_0011b6a7;
  }
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
  pfVar25 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b372;
    fdb_kvs_close(*(fdb_kvs_handle **)(auStack_1368 + (long)pfVar25 * 8 + 8));
    pfVar25 = (fdb_kvs_handle *)((long)pfVar25 + 1);
  } while (pfVar13 != pfVar25);
  pfStack_1398 = (fdb_kvs_handle *)0x11b396;
  fVar2 = fdb_open((fdb_file_handle **)&fStack_1310,"./mvcc_test6",
                   (fdb_config *)&fStack_1030.config.encryption_key);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
  pfStack_1398 = (fdb_kvs_handle *)0x11b3bc;
  fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1310.name,(fdb_kvs_handle **)auStack_1368,"kv0",
                       (fdb_kvs_config *)(auStack_1330 + 8));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
  pfStack_1398 = (fdb_kvs_handle *)0x11b3d7;
  fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
  pfStack_1398 = (fdb_kvs_handle *)0x11b3ea;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)auStack_1368._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
  pfStack_1398 = (fdb_kvs_handle *)0x11b3ff;
  fVar2 = fdb_close((fdb_file_handle *)fStack_1310.name);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_1398 = (fdb_kvs_handle *)0x11b41a;
    fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
    goto LAB_0011b41a;
  }
  goto LAB_0011b6c5;
LAB_0011be65:
  pfStack_1840 = (fdb_kvs_handle *)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  pfStack_1840 = (fdb_kvs_handle *)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  pfStack_19f8 = (fdb_kvs_handle *)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_3eb0 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_3eb0 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_3eb0 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_3eb0 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_3eb0 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_3eb0 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_3eb0 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_43b8 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_4590 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_4590 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011b672:
  pfStack_1398 = (fdb_kvs_handle *)0x11b677;
  rollback_all_test();
LAB_0011b677:
  pfStack_1398 = (fdb_kvs_handle *)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  pfStack_1398 = (fdb_kvs_handle *)0x11b684;
  rollback_all_test();
  pfVar25 = (fdb_kvs_handle *)__ptr;
LAB_0011b684:
  pfStack_1398 = (fdb_kvs_handle *)0x11b689;
  rollback_all_test();
LAB_0011b689:
  pfStack_1398 = (fdb_kvs_handle *)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  pfStack_1398 = (fdb_kvs_handle *)0x11b693;
  rollback_all_test();
LAB_0011b693:
  pfStack_1398 = (fdb_kvs_handle *)0x11b698;
  rollback_all_test();
LAB_0011b698:
  pfStack_1398 = (fdb_kvs_handle *)0x11b69d;
  rollback_all_test();
LAB_0011b69d:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6a2;
  rollback_all_test();
LAB_0011b6a2:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6a7;
  rollback_all_test();
LAB_0011b6a7:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6ac;
  rollback_all_test();
LAB_0011b6ac:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6b1;
  rollback_all_test();
LAB_0011b6b1:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6b6;
  rollback_all_test();
LAB_0011b6b6:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6bb;
  rollback_all_test();
LAB_0011b6bb:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6c0;
  rollback_all_test();
LAB_0011b6c0:
  pfStack_1398 = (fdb_kvs_handle *)0x11b6c5;
  rollback_all_test();
LAB_0011b6c5:
  pfStack_1398 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_1590 = (fdb_kvs_handle *)0x11b6e7;
  pfStack_13c0 = pfVar25;
  pfStack_13b8 = unaff_R12;
  pfStack_13b0 = unaff_R13;
  pfStack_13a8 = (fdb_txn *)pcVar22;
  pfStack_13a0 = (fdb_kvs_handle *)pcVar8;
  pfStack_1398 = pfVar13;
  gettimeofday(&tStack_1518,(__timezone_ptr_t)0x0);
  pfStack_1590 = (fdb_kvs_handle *)0x11b6ec;
  memleak_start();
  pfVar23 = (filemgr_ops *)auStack_155c;
  auStack_155c._0_4_ = 0;
  pfStack_1590 = (fdb_kvs_handle *)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar25 = (fdb_kvs_handle *)&stack0xffffffffffffeb48;
  pfStack_1590 = (fdb_kvs_handle *)0x11b714;
  fdb_get_default_config();
  uStack_148a = 1;
  uStack_1498 = 1;
  pcStack_1460 = compaction_cb_count;
  auStack_1458[0] = ' ';
  auStack_1458[1] = '\0';
  auStack_1458[2] = '\0';
  auStack_1458[3] = '\0';
  pbStack_1480 = (btree *)0x1;
  pfVar16 = (fdb_kvs_handle *)0x156054;
  pfStack_1590 = (fdb_kvs_handle *)0x11b74e;
  pfStack_1450 = pfVar23;
  fVar2 = fdb_open(&pfStack_1568,"mvcc_test1",(fdb_config *)pfVar25);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar25 = (fdb_kvs_handle *)(auStack_155c + 4);
    pfStack_1590 = (fdb_kvs_handle *)0x11b763;
    fdb_get_default_kvs_config();
    _Stack_14f8 = aStack_1548.super___atomic_base<unsigned_long>._M_i;
    _Stack_1508._M_i = auStack_155c._4_8_;
    pkStack_1500 = pkStack_1550;
    pfVar16 = (fdb_kvs_handle *)&pfStack_1570;
    pfStack_1590 = (fdb_kvs_handle *)0x11b788;
    fVar2 = fdb_kvs_open_default
                      (pfStack_1568,(fdb_kvs_handle **)pfVar16,(fdb_kvs_config *)&_Stack_1508);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13 = (fdb_kvs_handle *)0x156958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar8 = (char *)0xcccccccd;
      pfVar14 = (fdb_kvs_handle *)0x1565bd;
      pfVar16 = (fdb_kvs_handle *)(auStack_155c + 4);
      iVar3 = (int)unaff_R12;
      pfStack_1590 = (fdb_kvs_handle *)0x11b7bc;
      sprintf((char *)pfVar16,"%d",unaff_R12);
      pfVar13 = pfStack_1570;
      pfStack_1590 = (fdb_kvs_handle *)0x11b7c9;
      sVar5 = strlen((char *)pfVar16);
      pfStack_1590 = (fdb_kvs_handle *)0x11b7e0;
      fVar2 = fdb_set_kv(pfVar13,pfVar16,sVar5,"value",5);
      pfVar15 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1590 = (fdb_kvs_handle *)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        pfVar25 = pfVar13;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar15;
        doc_01 = (fdb_kvs_handle *)pcVar8;
LAB_0011ba3c:
        pfVar15 = unaff_R13;
        unaff_R13 = pfVar14;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba5b;
        pfVar16 = pfVar25;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        pfStack_1590 = (fdb_kvs_handle *)0x11ba60;
        auto_compaction_snapshots_test();
        pfVar13 = unaff_R13;
        pcVar8 = (char *)doc_01;
LAB_0011ba60:
        unaff_R13 = pfVar15;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        pfVar23 = (filemgr_ops *)(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      pfVar13 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar16 = (fdb_kvs_handle *)0x0;
        pfStack_1590 = (fdb_kvs_handle *)0x11b80c;
        fVar2 = fdb_commit(pfStack_1568,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      pfVar25 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_1590 = (fdb_kvs_handle *)0x11b83d;
        fVar2 = fdb_get_kvs_info(pfStack_1570,&fStack_14e8);
        pfVar25 = (fdb_kvs_handle *)fStack_14e8.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        pfStack_1590 = (fdb_kvs_handle *)0x11b85f;
        fVar2 = fdb_snapshot_open(pfStack_1570,&pfStack_1578,fStack_14e8.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        pfStack_1590 = (fdb_kvs_handle *)0x11b885;
        fdb_doc_create((fdb_doc **)&pfStack_1580,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_1580->fhandle = (fdb_file_handle *)pfVar25;
        pfStack_1590 = (fdb_kvs_handle *)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_1578,(fdb_doc *)pfStack_1580);
        pfVar15 = pfStack_1580;
        doc_01 = (fdb_kvs_handle *)pcVar8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar8 = (char *)pfStack_1580->op_stats;
        pfStack_1590 = (fdb_kvs_handle *)0x11b8b9;
        sVar5 = strlen(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11b8c7;
        iVar4 = bcmp(pcVar8,auStack_155c + 4,sVar5);
        doc_01 = (fdb_kvs_handle *)pcVar8;
        if (iVar4 != 0) goto LAB_0011ba41;
        pfStack_1590 = (fdb_kvs_handle *)0x11b8d7;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfStack_1590 = (fdb_kvs_handle *)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_1578);
        pfVar14 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        pfVar16 = (fdb_kvs_handle *)&pfStack_1578;
        pfStack_1590 = (fdb_kvs_handle *)0x11b8ff;
        fVar2 = fdb_snapshot_open(pfStack_1570,(fdb_kvs_handle **)pfVar16,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        pfStack_1590 = (fdb_kvs_handle *)0x11b925;
        fdb_doc_create((fdb_doc **)&pfStack_1580,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_1580->fhandle = (fdb_file_handle *)pfVar25;
        pfStack_1590 = (fdb_kvs_handle *)0x11b938;
        pfVar16 = pfStack_1580;
        fVar2 = fdb_get_byseq(pfStack_1578,(fdb_doc *)pfStack_1580);
        doc_01 = pfStack_1580;
        pfVar13 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        pfVar25 = (fdb_kvs_handle *)pfStack_1580->op_stats;
        pfVar16 = (fdb_kvs_handle *)(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11b956;
        sVar5 = strlen((char *)pfVar16);
        pfStack_1590 = (fdb_kvs_handle *)0x11b964;
        iVar4 = bcmp(pfVar25,pfVar16,sVar5);
        if (iVar4 != 0) goto LAB_0011ba4e;
        pfStack_1590 = (fdb_kvs_handle *)0x11b974;
        fdb_doc_free((fdb_doc *)doc_01);
        pfStack_1590 = (fdb_kvs_handle *)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_1578);
        pcVar8 = (char *)0xcccccccd;
        pfVar13 = (fdb_kvs_handle *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      pfVar23 = (filemgr_ops *)(auStack_155c + 4);
      pcVar8 = (char *)0xcccccccd;
      pfVar13 = (fdb_kvs_handle *)0x1565bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_1590 = (fdb_kvs_handle *)0x11b9b0;
    fVar2 = fdb_close(pfStack_1568);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    pfStack_1590 = (fdb_kvs_handle *)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1590 = (fdb_kvs_handle *)0x11b9ca;
      memleak_end();
      pfStack_1590 = (fdb_kvs_handle *)0x11b9e4;
      sprintf(auStack_155c + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_155c._0_4_);
      pcVar8 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_1590 = (fdb_kvs_handle *)0x11ba11;
      fprintf(_stderr,pcVar8,auStack_155c + 4);
      return;
    }
  }
  else {
LAB_0011ba6a:
    pfStack_1590 = (fdb_kvs_handle *)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    pfStack_1590 = (fdb_kvs_handle *)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    pfStack_1590 = (fdb_kvs_handle *)0x11ba79;
    auto_compaction_snapshots_test();
  }
  pfStack_1590 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar15 = (fdb_kvs_handle *)((ulong)pfVar16 & 0xffffffff);
  __tv = &tStack_15a8;
  pfStack_15b8 = (fdb_kvs_handle *)0x11ba95;
  pfStack_1598 = pfVar25;
  pfStack_1590 = pfVar13;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar16 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_1580->kvs_config = *(int *)&pfStack_1580->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_15b8 = (fdb_kvs_handle *)0x11bab4;
    compaction_cb_count();
  }
  pfStack_15b8 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_1840 = (fdb_kvs_handle *)0x11bad9;
  pfStack_15d8 = unaff_R12;
  pfStack_15d0 = unaff_R13;
  pfStack_15c8 = pfVar23;
  pfStack_15c0 = (fdb_kvs_handle *)pcVar8;
  pfStack_15b8 = pfVar15;
  gettimeofday((timeval *)(auStack_180f + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_1840 = (fdb_kvs_handle *)0x11bade;
  memleak_start();
  iStack_182c = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_1840 = (fdb_kvs_handle *)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_1840 = (fdb_kvs_handle *)0x11bb08;
    fdb_get_default_config();
    fconfig_01 = &fStack_16d8;
    pfStack_1840 = (fdb_kvs_handle *)0x11bb20;
    memcpy(fconfig_01,auStack_17d0,0xf8);
    fStack_16d8.block_reusing_threshold = 0;
    pfStack_1840 = (fdb_kvs_handle *)0x11bb3f;
    fVar2 = fdb_open(&pfStack_1820,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1840 = (fdb_kvs_handle *)0x11bb54;
      fdb_get_default_kvs_config();
      auStack_180f._39_8_ = uStack_17c0;
      auStack_180f._23_8_ = auStack_17d0._0_8_;
      auStack_180f._31_8_ = auStack_17d0._8_8_;
      pfStack_1840 = (fdb_kvs_handle *)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_1820,&pfStack_1828,(fdb_kvs_config *)(auStack_180f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_182c) {
        unaff_R13 = (fdb_kvs_handle *)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_17d0 >> 8),1);
        uVar12 = 0;
        do {
          uVar11 = uVar12 + 1;
          pfVar15 = (fdb_kvs_handle *)(ulong)uVar11;
          pfStack_1840 = (fdb_kvs_handle *)0x11bbb0;
          sprintf(auStack_180f,"%d",pfVar15);
          unaff_R12 = pfStack_1828;
          pfStack_1840 = (fdb_kvs_handle *)0x11bbbd;
          sVar5 = strlen(auStack_180f);
          pfStack_1840 = (fdb_kvs_handle *)0x11bbd8;
          fVar2 = fdb_set_kv(unaff_R12,auStack_180f,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            pfStack_1840 = (fdb_kvs_handle *)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar9 = __tv;
          if ((int)((ulong)unaff_R13 / 10) * 10 - 1U == uVar12) {
            ptVar9 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            pfStack_1840 = (fdb_kvs_handle *)0x11bc18;
            fdb_commit(pfStack_1820,~(byte)__tv & 1);
          }
          unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
          __tv = ptVar9;
          uVar12 = uVar11;
        } while ((int)uVar11 < iStack_182c);
      }
      pfVar15 = (fdb_kvs_handle *)0x1;
      pfStack_1840 = (fdb_kvs_handle *)0x11bc3f;
      fdb_commit(pfStack_1820,'\x01');
      pfStack_1840 = (fdb_kvs_handle *)0x11bc4e;
      fdb_get_kvs_info(pfStack_1828,(fdb_kvs_info *)auStack_17d0);
      __tv = (timeval *)(auStack_17d0 + 8);
      if ((fdb_config *)auStack_17d0._8_8_ != (fdb_config *)(long)iStack_182c) {
        pfStack_1840 = (fdb_kvs_handle *)0x11bc6a;
        rollback_during_ops_test();
      }
      pfStack_1840 = (fdb_kvs_handle *)0x11bc82;
      pthread_create(&pStack_1818,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_182c);
      fconfig_01 = (fdb_config *)0x156958;
      pcVar8 = auStack_180f;
      unaff_R12 = (fdb_kvs_handle *)0x1565bd;
      do {
        pfStack_1840 = (fdb_kvs_handle *)0x11bca4;
        sprintf(pcVar8,"%d",pfVar15);
        unaff_R13 = pfStack_1828;
        pfStack_1840 = (fdb_kvs_handle *)0x11bcb1;
        sVar5 = strlen(pcVar8);
        pfStack_1840 = (fdb_kvs_handle *)0x11bcc8;
        fVar2 = fdb_set_kv(unaff_R13,pcVar8,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          pfStack_1840 = (fdb_kvs_handle *)0x11bce4;
          fVar2 = fdb_commit(pfStack_1820,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        uVar12 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar12 != 0x2711);
      pfStack_1840 = (fdb_kvs_handle *)0x11bd0a;
      pthread_join(pStack_1818,(void **)(auStack_180f + 0xf));
      pfStack_1840 = (fdb_kvs_handle *)0x11bd2d;
      fVar2 = fdb_set_kv(pfStack_1828,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      pfStack_1840 = (fdb_kvs_handle *)0x11bd44;
      fVar2 = fdb_commit(pfStack_1820,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      pfStack_1840 = (fdb_kvs_handle *)0x11bd5e;
      fdb_get_kvs_info(pfStack_1828,(fdb_kvs_info *)auStack_17d0);
      fconfig_01 = (fdb_config *)auStack_17d0._8_8_;
      pfStack_1840 = (fdb_kvs_handle *)0x11bd85;
      fVar2 = fdb_set_kv(pfStack_1828,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      pfStack_1840 = (fdb_kvs_handle *)0x11bdb0;
      fVar2 = fdb_set_kv(pfStack_1828,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      pfStack_1840 = (fdb_kvs_handle *)0x11bdc7;
      fVar2 = fdb_commit(pfStack_1820,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      pfStack_1840 = (fdb_kvs_handle *)0x11bddc;
      fVar2 = fdb_rollback(&pfStack_1828,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_1840 = (fdb_kvs_handle *)0x11bdf6;
        fdb_get_kvs_info(pfStack_1828,(fdb_kvs_info *)auStack_17d0);
        if ((fdb_config *)auStack_17d0._8_8_ != fconfig_01) {
          pfStack_1840 = (fdb_kvs_handle *)0x11be07;
          rollback_during_ops_test();
        }
        pfStack_1840 = (fdb_kvs_handle *)0x11be11;
        fdb_close(pfStack_1820);
        pfStack_1840 = (fdb_kvs_handle *)0x11be16;
        fdb_shutdown();
        pfStack_1840 = (fdb_kvs_handle *)0x11be1b;
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pfStack_1840 = (fdb_kvs_handle *)0x11be4c;
        fprintf(_stderr,pcVar8,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_1840 = (fdb_kvs_handle *)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_17d0;
      pfStack_1840 = (fdb_kvs_handle *)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      pfStack_1840 = (fdb_kvs_handle *)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      pfStack_1840 = (fdb_kvs_handle *)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      pfStack_1840 = (fdb_kvs_handle *)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      pfStack_1840 = (fdb_kvs_handle *)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      pfStack_1840 = (fdb_kvs_handle *)0x11bfbb;
      rollback_during_ops_test();
    }
    pfStack_1840 = (fdb_kvs_handle *)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    pfStack_1840 = (fdb_kvs_handle *)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_01 = (fdb_config *)auStack_17d0;
    pfStack_1840 = (fdb_kvs_handle *)0x11be7c;
    fdb_get_default_config();
    pcVar8 = (char *)&fStack_16d8;
    pfStack_1840 = (fdb_kvs_handle *)0x11be94;
    memcpy(pcVar8,fconfig_01,0xf8);
    fStack_16d8.block_reusing_threshold = 0;
    pfStack_1840 = (fdb_kvs_handle *)0x11beb3;
    fVar2 = fdb_open(&pfStack_1820,"mvcc_test1",(fdb_config *)pcVar8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_01 = (fdb_config *)auStack_17d0;
    pfStack_1840 = (fdb_kvs_handle *)0x11bec8;
    fdb_get_default_kvs_config();
    auStack_180f._39_8_ = uStack_17c0;
    auStack_180f._23_8_ = auStack_17d0._0_8_;
    auStack_180f._31_8_ = auStack_17d0._8_8_;
    pfStack_1840 = (fdb_kvs_handle *)0x11beeb;
    fVar2 = fdb_kvs_open_default(pfStack_1820,&pfStack_1828,(fdb_kvs_config *)(auStack_180f + 0x17))
    ;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_182c = (int)__tv->tv_sec;
      if (1 < (long)iStack_182c) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x156958;
        pcVar8 = auStack_180f;
        unaff_R12 = (fdb_kvs_handle *)0x1565bd;
        __tv = (timeval *)(long)iStack_182c;
        do {
          pfStack_1840 = (fdb_kvs_handle *)0x11bf2c;
          sprintf(pcVar8,"%d",(ulong)__tv & 0xffffffff);
          pfVar15 = pfStack_1828;
          pfStack_1840 = (fdb_kvs_handle *)0x11bf39;
          sVar5 = strlen(pcVar8);
          pfStack_1840 = (fdb_kvs_handle *)0x11bf50;
          fVar2 = fdb_set_kv(pfVar15,pcVar8,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_1840 = (fdb_kvs_handle *)0x11bf76;
            fVar2 = fdb_rollback(&pfStack_1828,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_1840 = (fdb_kvs_handle *)0x11bf91;
      fdb_close(pfStack_1820);
      pfStack_1840 = (fdb_kvs_handle *)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_1840 = (fdb_kvs_handle *)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  pfStack_1840 = (fdb_kvs_handle *)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  pfStack_1840 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_19f8 = (fdb_kvs_handle *)0x11bff0;
  ptStack_1860 = __tv;
  pfStack_1858 = unaff_R12;
  pfStack_1850 = unaff_R13;
  pfStack_1848 = fconfig_01;
  pfStack_1840 = (fdb_kvs_handle *)pcVar8;
  gettimeofday((timeval *)(auStack_19bf + 0xf),(__timezone_ptr_t)0x0);
  pfStack_19f8 = (fdb_kvs_handle *)0x11bff5;
  memleak_start();
  pfStack_19f8 = (fdb_kvs_handle *)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_1958;
  pfStack_19f8 = (fdb_kvs_handle *)0x11c011;
  fdb_get_default_config();
  pfStack_19f8 = (fdb_kvs_handle *)0x11c025;
  fVar2 = fdb_open(&pfStack_19e0,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_19a0 + 0x30);
    pfStack_19f8 = (fdb_kvs_handle *)0x11c03d;
    fdb_get_default_kvs_config();
    pfStack_19f8 = (fdb_kvs_handle *)0x11c04f;
    fVar2 = fdb_kvs_open_default(pfStack_19e0,&pfStack_19e8,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x156958;
    pcVar8 = auStack_19bf;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c07e;
      sprintf(pcVar8,"%d",fconfig_00);
      unaff_R13 = pfStack_19e8;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c08b;
      sVar5 = strlen(pcVar8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c0a2;
      fVar2 = fdb_set_kv(unaff_R13,pcVar8,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_19f8 = (fdb_kvs_handle *)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar12 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar12;
    } while (uVar12 != 4);
    pfStack_19f8 = (fdb_kvs_handle *)0x11c0bd;
    fdb_commit(pfStack_19e0,'\0');
    pfStack_19f8 = (fdb_kvs_handle *)0x11c0e0;
    fVar2 = fdb_set_kv(pfStack_19e8,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c10b;
    fVar2 = fdb_set_kv(pfStack_19e8,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c122;
    fVar2 = fdb_commit(pfStack_19e0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c139;
    fVar2 = fdb_rollback(&pfStack_19e8,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_00 = (fdb_config *)auStack_19a0;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c153;
    fdb_get_kvs_info(pfStack_19e8,(fdb_kvs_info *)fconfig_00);
    if (auStack_19a0._8_8_ != 3) {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    pfStack_19f8 = (fdb_kvs_handle *)0x11c17a;
    fVar2 = fdb_snapshot_open(pfStack_19e8,&pfStack_19c8,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c1a2;
    fdb_iterator_init(pfStack_19c8,&pfStack_19d8,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_19d0;
    pfStack_19d0 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_19d8,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1d3;
      fdb_doc_free(pfStack_19d0);
      pfStack_19d0 = (fdb_doc *)0x0;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_19d8);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c201;
      fdb_iterator_close(pfStack_19d8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c20b;
      fdb_kvs_close(pfStack_19c8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c215;
      fdb_close(pfStack_19e0);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c21a;
      fdb_shutdown();
      pfStack_19f8 = (fdb_kvs_handle *)0x11c21f;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_19f8 = (fdb_kvs_handle *)0x11c250;
      fprintf(_stderr,pcVar8,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  pfStack_19f8 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_3eb0 = (code *)0x11c2b0;
  pfStack_1a20 = fconfig_00;
  pfStack_1a18 = unaff_R12;
  pfStack_1a10 = unaff_R13;
  pfStack_1a08 = fconfig_01;
  pfStack_1a00 = (fdb_kvs_handle *)pcVar8;
  pfStack_19f8 = pfVar15;
  gettimeofday(&tStack_3e38,(__timezone_ptr_t)0x0);
  pcStack_3eb0 = (code *)0x11c2b5;
  memleak_start();
  pcStack_3eb0 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_3eb0 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_3eb0 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_3d20.wal_threshold = 0x400;
  fStack_3d20.compaction_mode = 0;
  fStack_3d20.durability_opt = 2;
  pfVar13 = (fdb_kvs_handle *)(apfStack_3b28 + 0x20);
  ppfVar10 = apfStack_3e28;
  pcVar8 = "kvs%d";
  uVar21 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_3eb0 = (code *)0x11c31b;
    sprintf((char *)ppfVar10,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar22 = (char *)(apfStack_3e98 + (long)__s);
    pcStack_3eb0 = (code *)0x11c336;
    ppfVar18 = (fdb_kvs_handle **)pcVar22;
    fVar2 = fdb_open((fdb_file_handle **)pcVar22,(char *)ppfVar10,
                     (fdb_config *)(apfStack_3e28 + 0x21));
    iVar3 = (int)ppfVar18;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar18 = (fdb_kvs_handle **)0x0;
    ppfStack_3ea8 = __s;
    pfStack_3ea0 = pfVar13;
    do {
      __s = ppfVar18;
      pcStack_3eb0 = (code *)0x11c35b;
      sprintf((char *)ppfVar10,"kvs%d",(ulong)(uint)((int)__s + (int)uVar21));
      pfVar25 = *(fdb_kvs_handle **)pcVar22;
      pcStack_3eb0 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar25,(fdb_kvs_handle **)pfVar13,(char *)ppfVar10,
                           (fdb_kvs_config *)(apfStack_3e98 + 9));
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_3eb0 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
      ppfVar18 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_3ea8 + 1);
    uVar21 = uVar21 + 0x80;
    pfVar13 = (fdb_kvs_handle *)&pfStack_3ea0[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_3e28 + 0x40;
  ppfVar10 = apfStack_3b28;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_3eb0 = (code *)0x11c3cf;
      sprintf((char *)__s,"key%08d",uVar21);
      pcStack_3eb0 = (code *)0x11c3e2;
      sprintf((char *)ppfVar10,"value%08d",uVar21);
      pcVar8 = (char *)apfStack_3b28[(long)&pfVar13->op_stats];
      pcStack_3eb0 = (code *)0x11c3f2;
      sVar5 = strlen((char *)__s);
      pcVar22 = (char *)(sVar5 + 1);
      pcStack_3eb0 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar10);
      pcStack_3eb0 = (code *)0x11c413;
      pfVar25 = (fdb_kvs_handle *)pcVar8;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar8,__s,(size_t)pcVar22,ppfVar10,sVar5 + 1);
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar12 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar22 = (char *)0x0;
  do {
    pfVar25 = apfStack_3e98[(long)pcVar22];
    if (((ulong)pcVar22 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\0');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_3eb0 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\x01');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar22 = (char *)((long)pcVar22 + 1);
  } while (pcVar22 != (char *)0x8);
  pcVar22 = "key%08d";
  __s = apfStack_3e28 + 0x40;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_3eb0 = (code *)0x11c488;
      sprintf((char *)__s,"key%08d",uVar21);
      pfVar13 = apfStack_3b28[(long)(ppfVar10 + 4)];
      pcStack_3eb0 = (code *)0x11c498;
      sVar5 = strlen((char *)__s);
      pcStack_3eb0 = (code *)0x11c4a7;
      pfVar25 = pfVar13;
      fVar2 = fdb_del_kv(pfVar13,__s,sVar5 + 1);
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar12 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while (ppfVar10 != (fdb_kvs_handle **)0x400);
  pcVar22 = (char *)0x0;
  do {
    pfVar25 = apfStack_3e98[(long)pcVar22];
    if (((ulong)pcVar22 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\0');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_3eb0 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\x01');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar22 = (char *)((long)pcVar22 + 1);
  } while (pcVar22 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar22 = (char *)(apfStack_3b28 + 0x20);
  do {
    pcStack_3eb0 = (code *)0x11c515;
    ppfVar18 = (fdb_kvs_handle **)pcVar22;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar22,10);
    iVar3 = (int)ppfVar18;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s = __s + 8;
    pcVar22 = (char *)((long)pcVar22 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar10 = apfStack_3e98;
  pcVar22 = "kvs%d";
  __s = apfStack_3e28;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfVar25 = apfStack_3b28[(long)&pfVar13->op_stats];
    pcStack_3eb0 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar25);
    iVar3 = (int)pfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_3eb0 = (code *)0x11c56d;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar13 & 0xffffffff);
    pfVar25 = *ppfVar10;
    pcStack_3eb0 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar25,(char *)__s);
    iVar3 = (int)pfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->config).wal_threshold;
    ppfVar10 = ppfVar10 + 1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar22 = (char *)0x0;
  do {
    pfVar25 = apfStack_3e98[(long)pcVar22];
    if (((ulong)pcVar22 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\0');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_3eb0 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar25,'\x01');
      iVar3 = (int)pfVar25;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar22 = (char *)((long)pcVar22 + 1);
  } while (pcVar22 != (char *)0x8);
  pcVar22 = "mvcc_test_compact%d";
  __s = apfStack_3e28;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_3eb0 = (code *)0x11c5eb;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar13 & 0xffffffff);
    pfVar25 = apfStack_3e98[(long)pfVar13];
    pcStack_3eb0 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar25,(char *)__s);
    iVar3 = (int)pfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x8);
  pcVar22 = (char *)0x0;
  pcStack_3eb0 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar25 = apfStack_3e98[(long)pcVar22];
    pcStack_3eb0 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar25);
    iVar3 = (int)pfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar22 = (char *)((long)pcVar22 + 1);
    if (pcVar22 == (char *)0x8) {
      pcStack_3eb0 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_3eb0 = (code *)0x11c633;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_3eb0 = (code *)0x11c664;
      fprintf(_stderr,pcVar8,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_3eb0 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_3eb0 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_3eb0 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_3eb0 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_3eb0 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_3eb0 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_3eb0 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_43b8 = (code *)0x11c6e3;
  ppfStack_3ed8 = (fdb_kvs_handle **)pcVar22;
  ppfStack_3ed0 = ppfVar10;
  pfStack_3ec8 = (fdb_kvs_handle *)pcVar8;
  ppfStack_3ec0 = __s;
  pfStack_3eb8 = pfVar13;
  pcStack_3eb0 = (code *)uVar21;
  gettimeofday(&tStack_4330,(__timezone_ptr_t)0x0);
  pcStack_43b8 = (code *)0x11c6e8;
  memleak_start();
  pcStack_43b8 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_43b8 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_3fd0.flags = 1;
  fStack_3fd0.block_reusing_threshold = 0;
  fStack_3fd0.seqtree_opt = 0;
  pcStack_43b8 = (code *)0x11c728;
  fStack_3fd0.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_43b8 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_43a0,"./mvcc_test1",(fdb_config *)(acStack_40d0 + 0x100));
  iStack_437c = iVar3;
  if (iVar3 == 0) {
    pcStack_43b8 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_43a0,apfStack_4370,&fStack_4350);
    pcVar8 = (char *)0x1;
  }
  else {
    ppfVar10 = apfStack_4370;
    uVar21 = 0;
    do {
      pcStack_43b8 = (code *)0x11c76d;
      sprintf(acStack_4338,"kv%d",uVar21 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_43a0,ppfVar10,acStack_4338,&fStack_4350);
      uVar21 = uVar21 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar21 != 3);
    pcVar8 = (char *)0x3;
  }
  uStack_43a4 = 0;
  do {
    uVar21 = 0;
    do {
      pcStack_43b8 = (code *)0x11c7d4;
      sprintf(acStack_41d0,"key%d",uVar21 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c7f5;
      sprintf(acStack_4320,"meta-%d-%d",(ulong)uStack_43a4,uVar21 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c814;
      sprintf(acStack_40d0,"body-%d-%d",(ulong)uStack_43a4,uVar21 & 0xffffffff);
      doc = (btree *)(&bStack_4220.ksize + uVar21 * 8);
      pcStack_43b8 = (code *)0x11c827;
      sVar5 = strlen(acStack_41d0);
      pcStack_43b8 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_4320);
      pcStack_43b8 = (code *)0x11c842;
      sVar6 = strlen(acStack_40d0);
      pcStack_43b8 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_41d0,sVar5,acStack_4320,metalen._M_i,acStack_40d0,sVar6
                    );
      pfVar13 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_43b8 = (code *)0x11c878;
        fdb_set(apfStack_4370[(long)pfVar13],*(fdb_doc **)doc);
        pfVar13 = (fdb_kvs_handle *)((long)pfVar13 + 1);
      } while ((fdb_kvs_handle *)pcVar8 != pfVar13);
      pcStack_43b8 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_4220.ksize + uVar21 * 8));
      uVar21 = uVar21 + 1;
    } while (uVar21 != 10);
    pcStack_43b8 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_43a0,~(byte)uStack_43a4 & 1);
    uStack_43a4 = uStack_43a4 + 1;
    pcVar22 = (char *)(ulong)uStack_43a4;
  } while (uStack_43a4 != 5);
  pcStack_43b8 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_43a0,&pfStack_4388,&uStack_4358);
  pfVar25 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_43b8 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_4370,(pfStack_4388[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_4398 = (fdb_kvs_handle *)0x0;
    pcVar22 = acStack_40d0;
    pfVar25 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_43b8 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_4370[(long)pfVar25],&pfStack_4378,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_43b8 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_43b8 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_43b8 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_43b8 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_43b8 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_4378,&pfStack_4390,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_43b8 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_43b8 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_4390,(fdb_doc **)&pfStack_4398);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_43b8 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_43b8 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_43b8 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_43b8 = (code *)0x11c98b;
        sprintf(acStack_41d0,"key%d",metalen._M_i);
        if (pfVar25 == (fdb_kvs_handle *)0x0) {
          pcStack_43b8 = (code *)0x11c9da;
          sprintf(acStack_4320,"meta-1-%d",metalen._M_i);
          pcStack_43b8 = (code *)0x11c9ee;
          sprintf(pcVar22,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_43b8 = (code *)0x11c9ae;
          sprintf(acStack_4320,"meta-%d-%d",4,metalen._M_i);
          pcStack_43b8 = (code *)0x11c9c7;
          sprintf(pcVar22,"body-%d-%d",4);
        }
        pfVar13 = pfStack_4398;
        doc = (btree *)pfStack_4398->op_stats;
        pcStack_43b8 = (code *)0x11ca0a;
        iVar3 = bcmp(doc,acStack_41d0,*(size_t *)&pfStack_4398->kvs_config);
        if (iVar3 != 0) {
          pcStack_43b8 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar13->staletree;
        pcStack_43b8 = (code *)0x11ca2a;
        iVar3 = bcmp(doc,acStack_4320,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cba4;
        doc = (pfVar13->field_6).seqtree;
        pcStack_43b8 = (code *)0x11ca45;
        iVar3 = bcmp(doc,pcVar22,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011cb94;
        pcStack_43b8 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_4398 = (fdb_kvs_handle *)0x0;
        uVar12 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar12;
        pcStack_43b8 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_4390);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar12 != 10) goto LAB_0011cbbe;
      pcStack_43b8 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_4390);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_43b8 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_4378);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar25 = (fdb_kvs_handle *)&(pfVar25->kvs_config).field_0x1;
    } while (pfVar25 != (fdb_kvs_handle *)pcVar8);
    pcVar22 = (char *)0x0;
    do {
      pcStack_43b8 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_4370[(long)pcVar22]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar22 = pcVar22 + 1;
    } while (pcVar8 != pcVar22);
    pcStack_43b8 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_43a0,pfStack_4388[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_43b8 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_4388,uStack_4358);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_43b8 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_43a0);
      pcStack_43b8 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_43b8 = (code *)0x11cb10;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)iStack_437c != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pcStack_43b8 = (code *)0x11cb40;
      sprintf(acStack_40d0,"rollback without seqtree in %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_43b8 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar8,acStack_40d0);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_43b8 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_43b8 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_43b8 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_43b8 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_4590 = (fdb_kvs_handle *)0x11cc03;
  pcStack_43e0 = pcVar22;
  aStack_43d8.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_43d0 = doc;
  pfStack_43c8 = pfVar13;
  pfStack_43c0 = pfVar25;
  pcStack_43b8 = (code *)pcVar8;
  gettimeofday(&tStack_4530,(__timezone_ptr_t)0x0);
  pfStack_4590 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_4590 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar8 = auStack_4520 + 0x48;
  pfStack_4590 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_4590 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_4588,"./mvcc_test2",(fdb_config *)pcVar8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar8 = auStack_4520;
    pfStack_4590 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_4538 = (btreeblk_handle *)auStack_4520._16_8_;
    pfStack_4548 = (filemgr *)auStack_4520._0_8_;
    pdStack_4540 = (docio_handle *)auStack_4520._8_8_;
    pfStack_4590 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_4588,&pfStack_4580,(fdb_kvs_config *)&pfStack_4548);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_4590 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar8 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_4577;
    pfVar25 = (fdb_kvs_handle *)0x1565bd;
    uVar21 = 0;
    do {
      pfStack_4590 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar13,"key%d",uVar21);
      pfVar16 = pfStack_4580;
      pfStack_4590 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar13);
      pfStack_4590 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(pfVar16,pfVar13,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4590 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar12 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfStack_4590 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_4588,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_4590 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_4588,"./mvcc_test3");
    pfStack_4590 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar8 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_4577;
    uVar12 = 0;
    do {
      pfStack_4590 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar13,"key%d",(ulong)uVar12);
      pfVar25 = pfStack_4580;
      pfStack_4590 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar13);
      pfStack_4590 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar25,pfVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 10);
    pfStack_4590 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_4588,(fdb_file_info *)auStack_4520);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar8 = (char *)((ulong)auStack_4520._40_8_ / (ulong)uStack_44d4);
    pfStack_4590 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_4588);
    pfStack_4590 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_4590 = (fdb_kvs_handle *)0x11cdbe;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_44d4 * (long)pcVar8,
                       (ulong)((uStack_44d4 >> 2) + uStack_44d4 * 2));
    if (iVar3 < 0) goto LAB_0011cf90;
    pfStack_4590 = (fdb_kvs_handle *)0x11cde8;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar8 * 4 + 8) * (ulong)uStack_44d4,
                       (ulong)(uStack_44d4 >> 2));
    if (iVar3 < 0) goto LAB_0011cf95;
    pfStack_4590 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_4588,"./mvcc_test3",(fdb_config *)(auStack_4520 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar8 = (char *)&pfStack_4568;
    pfStack_4590 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_4538 = pbStack_4558;
    pfStack_4548 = pfStack_4568;
    pdStack_4540 = pdStack_4560;
    pfStack_4590 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_4588,&pfStack_4580,(fdb_kvs_config *)&pfStack_4548);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_4590 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar12 = 0;
      do {
        pfStack_4590 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_4577,"key%d",(ulong)uVar12);
        pfVar25 = pfStack_4580;
        pfStack_4590 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_4577);
        pfStack_4590 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar25,acStack_4577,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 10);
      pfStack_4590 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_4588);
      pfVar25 = (fdb_kvs_handle *)&pfStack_4568;
      uVar12 = 0;
      while( true ) {
        pfStack_4590 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_4577,"key%d",(ulong)uVar12);
        pfVar13 = pfStack_4580;
        pfStack_4590 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_4577);
        pfStack_4590 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar13,acStack_4577,sVar5,(void **)pfVar25,&sStack_4550);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_4590 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_4568);
        uVar12 = uVar12 + 1;
        if (uVar12 == 10) {
          pfStack_4590 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_4588);
          pfStack_4590 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_4590 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          pfStack_4590 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar8,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar13 = (fdb_kvs_handle *)acStack_4577;
      pcVar8 = "key%d";
      pfStack_4590 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_4590 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_4590 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_4590 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_45a0 = (fdb_config *)pcVar8;
  pfStack_4598 = pfVar13;
  pfStack_4590 = pfVar25;
  gettimeofday(&tStack_46c0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_46d0 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_46e0,"./mvcc_test1",&fStack_4698);
  fdb_kvs_open_default(pfStack_46e0,&pfStack_46c8,&fStack_46b0);
  fdb_kvs_open(pfStack_46e0,&pfStack_46e8,"kv",&fStack_46b0);
  fVar2 = fdb_set_kv(pfStack_46e8,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_46e8,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_46e0,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_46e8,&pfStack_46f0,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_46f0,&pfStack_46d8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_46f0);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_46e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_46e0,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_46d8,&pfStack_46d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_46d0);
    fVar2 = fdb_iterator_close(pfStack_46d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_46f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_46c8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_46e0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar8,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_wal_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 300;
    int num_kvs = 1;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 256;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test8", &fconfig);

    fdb_kvs_open_default(dbfile, &db[0], &kvs_config);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_wal_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // after 256 items wal gets flushed before commit

    // commit normal but as wal was flushed, this will cause a wal flush again!
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update first half documents again
    for (i = 0; i < n/2; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "META%d", i);
        sprintf(bodybuf, "BODY%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    }

    // commit again, this time wal threshold not hit so no wal flush on commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update remaining half documents
    for (; i < n; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "Meta%d", i);
        sprintf(bodybuf, "Body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // somewhere in this loop wal gets flushed before commit
    // normal commit results in wal flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_rollback(&db[0], n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 1; // pick a document in the WAL section upon rollback
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_snapshot_open(db[0], &snap_db, n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get(snap_db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)n + i + 1);
    fdb_doc_free(rdoc);
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to wal test %s", multi_kv ? "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}